

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O0

int __thiscall
JsUtil::
SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
::
Insert<(JsUtil::SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
          (SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  code *pcVar1;
  type tVar2;
  bool bVar3;
  int iVar4;
  int **ppiVar5;
  ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> **ppVVar6;
  undefined4 *puVar7;
  int local_58;
  type_conflict local_54;
  int index;
  TBKey k;
  int last;
  int i;
  EntryType *localEntries;
  hash_t local_38;
  uint targetBucket;
  hash_t hashCode;
  bool needSearch;
  int *localBuckets;
  TBValue *value_local;
  TBKey *key_local;
  SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *this_local;
  
  localBuckets = (int *)value;
  value_local = (TBValue *)key;
  key_local = (TBKey *)this;
  ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)(this + 8));
  _hashCode = *ppiVar5;
  if (_hashCode == (int *)0x0) {
    SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
    ::Initialize((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *)this,0);
    ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)(this + 8));
    _hashCode = *ppiVar5;
  }
  targetBucket._3_1_ = 1;
  local_38 = SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
             ::GetHashCodeWithKey<int>((int *)value_local);
  localEntries._4_4_ =
       SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
       ::GetBucket((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    *)this,local_38);
  ppVVar6 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__((WriteBarrierPtr *)(this + 0x10))
  ;
  _last = *ppVVar6;
  k = _hashCode[localEntries._4_4_];
  index = -1;
  while( true ) {
    do {
      if (k < 0) {
        if ((*(int *)(this + 0x38) == 0) && (*(int *)(this + 0x30) == *(int *)(this + 0x28))) {
          (*(code *)**(undefined8 **)this)();
        }
        if (*(int *)(this + 0x38) == 0) {
          if (*(int *)(this + 0x30) == *(int *)(this + 0x28)) {
            SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::Resize((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                      *)this);
            localEntries._4_4_ =
                 SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                 ::GetBucket((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                              *)this,local_38);
            local_58 = *(int *)(this + 0x30);
            *(int *)(this + 0x30) = *(int *)(this + 0x30) + 1;
          }
          else {
            local_58 = *(int *)(this + 0x30);
            *(int *)(this + 0x30) = *(int *)(this + 0x30) + 1;
          }
          if (*(int *)(this + 0x28) < *(int *)(this + 0x30)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                               ,0x2ba,"(count <= size)","count <= size");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          if (*(int *)(this + 0x28) <= local_58) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                               ,699,"(index < size)","index < size");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
        }
        else {
          if (*(int *)(this + 0x38) < 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                               ,0x29d,"(freeCount > 0)","freeCount > 0");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          if (*(int *)(this + 0x34) < 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                               ,0x29e,"(freeList >= 0)","freeList >= 0");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          if (*(int *)(this + 0x30) <= *(int *)(this + 0x34)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                               ,0x29f,"(freeList < count)","freeList < count");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          local_58 = *(int *)(this + 0x34);
          *(int *)(this + 0x38) = *(int *)(this + 0x38) + -1;
          if (*(int *)(this + 0x38) != 0) {
            ppVVar6 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                                ((WriteBarrierPtr *)(this + 0x10));
            iVar4 = SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    ::GetNextFreeEntryIndex(*ppVVar6 + local_58);
            *(int *)(this + 0x34) = iVar4;
          }
        }
        SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
        ::SetKeyValue<false>
                  ((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    *)this,(TBKey *)value_local,(TBValue *)localBuckets,local_58);
        ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)(this + 8));
        iVar4 = (*ppiVar5)[localEntries._4_4_];
        ppVVar6 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                            ((WriteBarrierPtr *)(this + 0x10));
        (*ppVVar6)[local_58].super_ValueEntryData<int>.next = iVar4;
        ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)(this + 8));
        (*ppiVar5)[localEntries._4_4_] = local_58;
        return local_58;
      }
      local_54 = SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                 ::GetKey<false>((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                                  *)this,k);
      tVar2 = SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              ::RemoveIfCollected<false>
                        ((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                          *)this,local_54,&k,index,localEntries._4_4_);
    } while (tVar2);
    bVar3 = DefaultComparer<int>::Equals(&local_54,(int *)value_local);
    if (bVar3) break;
    index = k;
    k = _last[k].super_ValueEntryData<int>.next;
  }
  SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  ::SetValue<false>((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                     *)this,(TBValue *)localBuckets,k);
  return k;
}

Assistant:

int Insert(const TBKey& key, const TBValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCodeWithKey<TBKey>(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }

                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            SetValue(value, i);
                            return i;
                        }
                        return -1;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (freeCount == 0 && count == size)
            {
                this->Cleanup();
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if (freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            SetKeyValue(key, value, index);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

            return index;
        }